

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_Tt8IsopCover(word *uOn,word *uOnDc,int nVars,word *uRes,int *pCover,int *pnCubes)

{
  int iVar1;
  int iVar2;
  word wVar3;
  int nEnd1;
  int nEnd0;
  int nBeg0;
  int c;
  word uRes2 [2];
  word uRes1 [2];
  word uRes0 [2];
  word uOnDc2 [2];
  word uOn2 [2];
  word uOn1 [2];
  word uOn0 [2];
  int *pnCubes_local;
  int *pCover_local;
  word *uRes_local;
  int nVars_local;
  word *uOnDc_local;
  word *uOn_local;
  
  if (nVars < 7) {
    wVar3 = Abc_Tt6IsopCover(*uOn,*uOnDc,nVars,pCover,pnCubes);
    uRes[3] = wVar3;
    uRes[2] = wVar3;
    uRes[1] = wVar3;
    *uRes = wVar3;
  }
  else if ((nVars == 7) ||
          ((((*uOn == uOn[2] && (uOn[1] == uOn[3])) && (*uOnDc == uOnDc[2])) &&
           (uOnDc[1] == uOnDc[3])))) {
    Abc_Tt7IsopCover(uOn,uOnDc,7,uRes,pCover,pnCubes);
    uRes[2] = *uRes;
    uRes[3] = uRes[1];
  }
  else {
    if (nVars != 8) {
      __assert_fail("nVars == 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x7d9,"void Abc_Tt8IsopCover(word *, word *, int, word *, int *, int *)");
    }
    uOn1[1] = *uOn & (uOnDc[2] ^ 0xffffffffffffffff);
    uOn2[1] = uOn[2] & (*uOnDc ^ 0xffffffffffffffff);
    uOn1[0] = uOn[3] & (uOnDc[1] ^ 0xffffffffffffffff);
    uRes0[1] = *uOnDc & uOnDc[2];
    uOnDc2[0] = uOnDc[1] & uOnDc[3];
    nEnd0 = *pnCubes;
    Abc_Tt7IsopCover(uOn1 + 1,uOnDc,7,uRes1 + 1,pCover,pnCubes);
    iVar1 = *pnCubes;
    Abc_Tt7IsopCover(uOn2 + 1,uOnDc + 2,7,uRes2 + 1,pCover,pnCubes);
    iVar2 = *pnCubes;
    uOnDc2[1] = *uOn & (uRes1[1] ^ 0xffffffffffffffff) | uOn[2] & (uRes2[1] ^ 0xffffffffffffffff);
    uOn2[0] = uOn[1] & (uRes0[0] ^ 0xffffffffffffffff) | uOn[3] & (uRes1[0] ^ 0xffffffffffffffff);
    Abc_Tt7IsopCover(uOnDc2 + 1,uRes0 + 1,7,(word *)&nBeg0,pCover,pnCubes);
    *uRes = _nBeg0 | uRes1[1];
    uRes[1] = uRes2[0] | uRes0[0];
    uRes[2] = _nBeg0 | uRes2[1];
    uRes[3] = uRes2[0] | uRes1[0];
    for (; nEnd0 < iVar1; nEnd0 = nEnd0 + 1) {
      pCover[nEnd0] = pCover[nEnd0] | 0x4000;
    }
    while (nEnd0 = iVar1, nEnd0 < iVar2) {
      pCover[nEnd0] = pCover[nEnd0] | 0x8000;
      iVar1 = nEnd0 + 1;
    }
    if ((((*uOn & (*uRes ^ 0xffffffffffffffff)) != 0) ||
        ((uOn[1] & (uRes[1] ^ 0xffffffffffffffff)) != 0)) ||
       (((uOn[2] & (uRes[2] ^ 0xffffffffffffffff)) != 0 ||
        ((uOn[3] & (uRes[3] ^ 0xffffffffffffffff)) != 0)))) {
      __assert_fail("(uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 && (uOn[2] & ~uRes[2]) == 0 && (uOn[3] & ~uRes[3]) == 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x7f3,"void Abc_Tt8IsopCover(word *, word *, int, word *, int *, int *)");
    }
    if ((((*uRes & (*uOnDc ^ 0xffffffffffffffff)) != 0) ||
        ((uRes[1] & (uOnDc[1] ^ 0xffffffffffffffff)) != 0)) ||
       (((uRes[2] & (uOnDc[2] ^ 0xffffffffffffffff)) != 0 ||
        ((uRes[3] & (uOnDc[3] ^ 0xffffffffffffffff)) != 0)))) {
      __assert_fail("(uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 && (uRes[2] & ~uOnDc[2])==0 && (uRes[3] & ~uOnDc[3])==0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilTruth.h"
                    ,0x7f4,"void Abc_Tt8IsopCover(word *, word *, int, word *, int *, int *)");
    }
  }
  return;
}

Assistant:

static inline void Abc_Tt8IsopCover( word uOn[4], word uOnDc[4], int nVars, word uRes[4], int * pCover, int * pnCubes )
{
    if ( nVars <= 6 )
        uRes[0] = uRes[1] = uRes[2] = uRes[3] = Abc_Tt6IsopCover( uOn[0], uOnDc[0], nVars, pCover, pnCubes );
    else if ( nVars == 7 || (uOn[0] == uOn[2] && uOn[1] == uOn[3] && uOnDc[0] == uOnDc[2] && uOnDc[1] == uOnDc[3]) )
    {
        Abc_Tt7IsopCover( uOn, uOnDc, 7, uRes, pCover, pnCubes );
        uRes[2] = uRes[0];
        uRes[3] = uRes[1];
    }
    else 
    {
        word uOn0[2], uOn1[2], uOn2[2], uOnDc2[2], uRes0[2], uRes1[2], uRes2[2];
        int c, nBeg0, nEnd0, nEnd1;
        assert( nVars == 8 );
        // cofactor
        uOn0[0] = uOn[0] & ~uOnDc[2];
        uOn0[1] = uOn[1] & ~uOnDc[3];
        uOn1[0] = uOn[2] & ~uOnDc[0];
        uOn1[1] = uOn[3] & ~uOnDc[1];
        uOnDc2[0] = uOnDc[0] & uOnDc[2];
        uOnDc2[1] = uOnDc[1] & uOnDc[3];
        // solve for cofactors
        nBeg0 = *pnCubes; 
        Abc_Tt7IsopCover( uOn0, uOnDc+0, 7, uRes0, pCover, pnCubes );
        nEnd0 = *pnCubes;
        Abc_Tt7IsopCover( uOn1, uOnDc+2, 7, uRes1, pCover, pnCubes );
        nEnd1 = *pnCubes;
        uOn2[0] = (uOn[0] & ~uRes0[0]) | (uOn[2] & ~uRes1[0]);
        uOn2[1] = (uOn[1] & ~uRes0[1]) | (uOn[3] & ~uRes1[1]);
        Abc_Tt7IsopCover( uOn2, uOnDc2, 7, uRes2, pCover, pnCubes );
        // derive the final truth table
        uRes[0] = uRes2[0] | uRes0[0];
        uRes[1] = uRes2[1] | uRes0[1];
        uRes[2] = uRes2[0] | uRes1[0];
        uRes[3] = uRes2[1] | uRes1[1];
        for ( c = nBeg0; c < nEnd0; c++ )
            pCover[c] |= (1 << (2*7+0));
        for ( c = nEnd0; c < nEnd1; c++ )
            pCover[c] |= (1 << (2*7+1));
        assert( (uOn[0] & ~uRes[0]) == 0 && (uOn[1] & ~uRes[1]) == 0 && (uOn[2] & ~uRes[2]) == 0 && (uOn[3] & ~uRes[3]) == 0 );
        assert( (uRes[0] & ~uOnDc[0])==0 && (uRes[1] & ~uOnDc[1])==0 && (uRes[2] & ~uOnDc[2])==0 && (uRes[3] & ~uOnDc[3])==0 );
    }
}